

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::AVisitor<hiberlite::UpdateBean>::pushAndSubPrefix
          (AVisitor<hiberlite::UpdateBean> *this,string *prefix)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::push_back
            (&(this->stack).c,&this->scope);
  paVar2 = &local_40.field_2;
  pcVar3 = (this->scope)._prefix._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (this->scope)._prefix._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_40._M_string_length == 0) {
    std::__cxx11::string::_M_append
              ((char *)&(this->scope)._prefix,(ulong)(prefix->_M_dataplus)._M_p);
  }
  else {
    std::operator+(&local_40,"_",prefix);
    std::__cxx11::string::_M_append((char *)&(this->scope)._prefix,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  piVar1 = &(this->scope).prefix_depth;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubPrefix(std::string prefix)
{
	stack.push(scope);
	if(scope.prefix().size())
		scope._prefix+="_"+prefix;
	else
		scope._prefix+=prefix;
	scope.prefix_depth++;
}